

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::listReporters
          (XmlReporter *this,
          vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
          *descriptions)

{
  undefined8 this_00;
  bool bVar1;
  XmlWriter *pXVar2;
  StringRef local_128;
  allocator<char> local_111;
  string local_110;
  StringRef local_f0;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  ScopedElement inner;
  ReporterDescription *reporter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *__range1;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement outerTag;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
  *descriptions_local;
  XmlReporter *this_local;
  
  outerTag._8_8_ = descriptions;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"AvailableReporters",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = outerTag._8_8_;
  __end1 = std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
           begin((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                 outerTag._8_8_);
  reporter = (ReporterDescription *)
             std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
             end((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
                 this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                                *)&reporter);
    if (!bVar1) break;
    inner._8_8_ = __gnu_cxx::
                  __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
                  ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"Reporter",&local_b1);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml,(XmlFormatting)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Name",&local_d9);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_d8,Indent);
    StringRef::StringRef(&local_f0,(string *)inner._8_8_);
    pXVar2 = XmlWriter::writeText(pXVar2,local_f0,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Description",&local_111);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_110,Indent);
    StringRef::StringRef(&local_128,(string *)(inner._8_8_ + 0x20));
    pXVar2 = XmlWriter::writeText(pXVar2,local_128,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
    __gnu_cxx::
    __normal_iterator<const_Catch::ReporterDescription_*,_std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>_>
    ::operator++(&__end1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  return;
}

Assistant:

void XmlReporter::listReporters(std::vector<ReporterDescription> const& descriptions) {
        auto outerTag = m_xml.scopedElement("AvailableReporters");
        for (auto const& reporter : descriptions) {
            auto inner = m_xml.scopedElement("Reporter");
            m_xml.startElement("Name", XmlFormatting::Indent)
                 .writeText(reporter.name, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
            m_xml.startElement("Description", XmlFormatting::Indent)
                 .writeText(reporter.description, XmlFormatting::None)
                 .endElement(XmlFormatting::Newline);
        }
    }